

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapElements
          (Reflection *this,Message *message,FieldDescriptor *field,int index1,int index2)

{
  float fVar1;
  double dVar2;
  byte bVar3;
  uint uVar4;
  void *pvVar5;
  unsigned_long uVar6;
  uint32_t uVar7;
  CppStringType CVar8;
  RepeatedField<int> *this_00;
  uint *puVar9;
  RepeatedField<unsigned_long> *this_01;
  unsigned_long *puVar10;
  RepeatedField<absl::lts_20250127::Cord> *this_02;
  MapFieldBase *this_03;
  RepeatedPtrFieldBase *this_04;
  void **ppvVar11;
  void **ppvVar12;
  RepeatedField<long> *this_05;
  RepeatedField<unsigned_int> *this_06;
  RepeatedField<bool> *this_07;
  bool *pbVar13;
  RepeatedField<double> *this_08;
  double *pdVar14;
  RepeatedField<float> *this_09;
  float *pfVar15;
  Nonnull<const_char_*> pcVar16;
  bool bVar17;
  char *description;
  Descriptor *pDVar18;
  Metadata MVar19;
  
  MVar19 = Message::GetMetadata(message);
  if (MVar19.reflection != this) {
    pDVar18 = this->descriptor_;
    MVar19 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar18,MVar19.descriptor,field,"Swap");
  }
  pDVar18 = this->descriptor_;
  if (field->containing_type_ != pDVar18) {
    description = "Field does not match message type.";
    goto LAB_001f1fa8;
  }
  bVar3 = field->field_0x1;
  bVar17 = (bool)((bVar3 & 0x20) >> 5);
  if (0xbf < bVar3 == bVar17) {
    pcVar16 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar17,0xbf < bVar3,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar16 != (Nonnull<const_char_*>)0x0) {
    SwapElements();
LAB_001f1f96:
    pDVar18 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
LAB_001f1fa8:
    anon_unknown_6::ReportReflectionUsageError(pDVar18,field,"Swap",description);
  }
  if ((field->field_0x1 & 0x20) == 0) goto LAB_001f1f96;
  if ((field->field_0x1 & 8) != 0) {
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    internal::ExtensionSet::SwapElements
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),field->number_
               ,index1,index2);
    return;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
  case 8:
    VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
    this_00 = (RepeatedField<int> *)MutableRawImpl(this,message,field);
    puVar9 = (uint *)RepeatedField<int>::elements
                               (this_00,(undefined1  [16])
                                        ((undefined1  [16])(this_00->soo_rep_).field_0 &
                                        (undefined1  [16])0x4) == (undefined1  [16])0x0);
    goto LAB_001f1e4b;
  case 2:
    VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
    this_05 = (RepeatedField<long> *)MutableRawImpl(this,message,field);
    puVar10 = (unsigned_long *)
              RepeatedField<long>::elements
                        (this_05,(undefined1  [16])
                                 ((undefined1  [16])(this_05->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    goto LAB_001f1e06;
  case 3:
    VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
    this_06 = (RepeatedField<unsigned_int> *)MutableRawImpl(this,message,field);
    puVar9 = RepeatedField<unsigned_int>::elements
                       (this_06,(undefined1  [16])
                                ((undefined1  [16])(this_06->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
LAB_001f1e4b:
    uVar4 = puVar9[index1];
    puVar9[index1] = puVar9[index2];
    puVar9[index2] = uVar4;
    break;
  case 4:
    VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
    this_01 = (RepeatedField<unsigned_long> *)MutableRawImpl(this,message,field);
    puVar10 = RepeatedField<unsigned_long>::elements
                        (this_01,(undefined1  [16])
                                 ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
LAB_001f1e06:
    uVar6 = puVar10[index1];
    puVar10[index1] = puVar10[index2];
    puVar10[index2] = uVar6;
    break;
  case 5:
    VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
    this_08 = (RepeatedField<double> *)MutableRawImpl(this,message,field);
    pdVar14 = RepeatedField<double>::elements
                        (this_08,(undefined1  [16])
                                 ((undefined1  [16])(this_08->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    dVar2 = pdVar14[index1];
    pdVar14[index1] = pdVar14[index2];
    pdVar14[index2] = dVar2;
    break;
  case 6:
    VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
    this_09 = (RepeatedField<float> *)MutableRawImpl(this,message,field);
    pfVar15 = RepeatedField<float>::elements
                        (this_09,(undefined1  [16])
                                 ((undefined1  [16])(this_09->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    fVar1 = pfVar15[index1];
    pfVar15[index1] = pfVar15[index2];
    pfVar15[index2] = fVar1;
    break;
  case 7:
    VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
    this_07 = (RepeatedField<bool> *)MutableRawImpl(this,message,field);
    pbVar13 = RepeatedField<bool>::elements
                        (this_07,(undefined1  [16])
                                 ((undefined1  [16])(this_07->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    bVar17 = pbVar13[index1];
    pbVar13[index1] = pbVar13[index2];
    pbVar13[index2] = bVar17;
    break;
  case 9:
    CVar8 = FieldDescriptor::cpp_string_type(field);
    if (CVar8 == kCord) {
      VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
      this_02 = (RepeatedField<absl::lts_20250127::Cord> *)MutableRawImpl(this,message,field);
      RepeatedField<absl::lts_20250127::Cord>::SwapElements(this_02,index1,index2);
      return;
    }
  case 10:
    if ((field->type_ == '\v') && (bVar17 = FieldDescriptor::is_map_message_type(field), bVar17)) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_03 = (MapFieldBase *)MutableRawImpl(this,message,field);
      this_04 = internal::MapFieldBase::MutableRepeatedField(this_03);
    }
    else {
      VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
      this_04 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
    }
    ppvVar11 = internal::RepeatedPtrFieldBase::element_at(this_04,index1);
    ppvVar12 = internal::RepeatedPtrFieldBase::element_at(this_04,index2);
    pvVar5 = *ppvVar11;
    *ppvVar11 = *ppvVar12;
    *ppvVar12 = pvVar5;
  }
  return;
}

Assistant:

void Reflection::SwapElements(Message* message, const FieldDescriptor* field,
                              int index1, int index2) const {
  USAGE_CHECK_MESSAGE(Swap, message);
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                 \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:              \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field) \
        ->SwapElements(index1, index2);                   \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          MutableRaw<RepeatedField<absl::Cord> >(message, field)
              ->SwapElements(index1, index2);
          break;
        }
        ABSL_FALLTHROUGH_INTENDED;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->SwapElements(index1, index2);
        }
        break;
    }
  }
}